

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O2

void absl::base_internal::CallOnceImpl<absl::(anonymous_namespace)::GetMutexGlobals()::__0>
               (atomic<unsigned_int> *control,SchedulingMode scheduling_mode,
               anon_class_1_0_00000001 *fn)

{
  __int_type_conflict2 _Var1;
  uint32_t uVar2;
  int iVar3;
  bool bVar4;
  
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  if ((((_Var1 != 0) && (_Var1 != 0xdd)) && (_Var1 != 0x5a308d2)) && (_Var1 != 0x65c2937b)) {
    raw_logging_internal::RawLog
              (kFatal,"call_once.h",0x9e,"Unexpected value for control word: 0x%lx");
  }
  LOCK();
  bVar4 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
  if (bVar4) {
    (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
  }
  UNLOCK();
  if ((bVar4) ||
     (uVar2 = SpinLockWait(control,3,
                           CallOnceImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/synchronization/mutex.cc:142:53)>
                           ::trans,SCHEDULE_KERNEL_ONLY), uVar2 == 0)) {
    iVar3 = NumCPUs();
    anon_unknown_11::GetMutexGlobals::data.spinloop_iterations = 0x5dc;
    if (iVar3 < 2) {
      anon_unknown_11::GetMutexGlobals::data.spinloop_iterations = 0;
    }
    anon_unknown_11::GetMutexGlobals::data.mutex_sleep_limit[0] = 5000;
    if (iVar3 < 2) {
      anon_unknown_11::GetMutexGlobals::data.mutex_sleep_limit[0] = 0;
    }
    anon_unknown_11::GetMutexGlobals::data.mutex_sleep_limit[1] = 0xfa;
    if (iVar3 < 2) {
      anon_unknown_11::GetMutexGlobals::data.mutex_sleep_limit[1] = 0;
    }
    LOCK();
    _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
    (control->super___atomic_base<unsigned_int>)._M_i = 0xdd;
    UNLOCK();
    if (_Var1 == 0x5a308d2) {
      AbslInternalSpinLockWake(control,true);
      return;
    }
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE
void CallOnceImpl(std::atomic<uint32_t>* control,
                  base_internal::SchedulingMode scheduling_mode, Callable&& fn,
                  Args&&... args) {
#ifndef NDEBUG
  {
    uint32_t old_control = control->load(std::memory_order_relaxed);
    if (old_control != kOnceInit &&
        old_control != kOnceRunning &&
        old_control != kOnceWaiter &&
        old_control != kOnceDone) {
      ABSL_RAW_LOG(FATAL, "Unexpected value for control word: 0x%lx",
                   static_cast<unsigned long>(old_control));  // NOLINT
    }
  }
#endif  // NDEBUG
  static const base_internal::SpinLockWaitTransition trans[] = {
      {kOnceInit, kOnceRunning, true},
      {kOnceRunning, kOnceWaiter, false},
      {kOnceDone, kOnceDone, true}};

  // Must do this before potentially modifying control word's state.
  base_internal::SchedulingHelper maybe_disable_scheduling(scheduling_mode);
  // Short circuit the simplest case to avoid procedure call overhead.
  // The base_internal::SpinLockWait() call returns either kOnceInit or
  // kOnceDone. If it returns kOnceDone, it must have loaded the control word
  // with std::memory_order_acquire and seen a value of kOnceDone.
  uint32_t old_control = kOnceInit;
  if (control->compare_exchange_strong(old_control, kOnceRunning,
                                       std::memory_order_relaxed) ||
      base_internal::SpinLockWait(control, ABSL_ARRAYSIZE(trans), trans,
                                  scheduling_mode) == kOnceInit) {
    base_internal::invoke(std::forward<Callable>(fn),
                          std::forward<Args>(args)...);
    old_control =
        control->exchange(base_internal::kOnceDone, std::memory_order_release);
    if (old_control == base_internal::kOnceWaiter) {
      base_internal::SpinLockWake(control, true);
    }
  }  // else *control is already kOnceDone
}